

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_exists(char *args)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcStack_10;
  int rc;
  char *args_local;
  
  pcStack_10 = args;
  if (*args == '\"') {
    pcStack_10 = args + 1;
    sVar2 = strlen(pcStack_10);
    pcStack_10[sVar2 - 1] = '\0';
  }
  iVar1 = PHYSFS_exists(pcStack_10);
  pcVar3 = "does not ";
  if (iVar1 != 0) {
    pcVar3 = "";
  }
  printf("File %sexists.\n",pcVar3);
  return 1;
}

Assistant:

static int cmd_exists(char *args)
{
    int rc;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    rc = PHYSFS_exists(args);
    printf("File %sexists.\n", rc ? "" : "does not ");
    return 1;
}